

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

int __thiscall
v_hashmap<substring,_unsigned_long>::init
          (v_hashmap<substring,_unsigned_long> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  _func_bool_substring_ptr_substring_ptr *in_RDX;
  
  if (ctx < (EVP_PKEY_CTX *)0x400) {
    ctx = (EVP_PKEY_CTX *)0x3ff;
  }
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize(&this->dat,(size_t)ctx);
  this->equivalent = (_func_bool_void_ptr_substring_ptr_substring_ptr *)0x0;
  this->equivalent_no_data = in_RDX;
  this->last_position = 0;
  this->num_occupants = 0;
  this->eq_data = (void *)0x0;
  return extraout_EAX;
}

Assistant:

void init(size_t min_size, bool (*eq)(const K&, const K&))
  {
    if (min_size < 1023)
      min_size = 1023;
    dat.resize(min_size);  // resize sets to 0 ==> occupied=false

    equivalent = nullptr;
    equivalent_no_data = eq;
    eq_data = nullptr;

    last_position = 0;
    num_occupants = 0;
  }